

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_word_matcher.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
assert_word_matcher<boost::xpressive::detail::word_begin,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::assert_word_matcher
          (assert_word_matcher<boost::xpressive::detail::word_begin,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  ctype<char> *pcVar1;
  ctype<char> cVar2;
  char_class_type cVar3;
  char_type name [2];
  undefined2 local_1a;
  
  local_1a = 0;
  pcVar1 = (tr->super_cpp_regex_traits<char>).ctype_;
  if (pcVar1[0x38] == (ctype<char>)0x0) {
    std::ctype<char>::_M_widen_init();
    cVar2 = (ctype<char>)(**(code **)(*(long *)pcVar1 + 0x30))(pcVar1,0x77);
  }
  else {
    cVar2 = pcVar1[0xb0];
  }
  local_1a = CONCAT11(local_1a._1_1_,cVar2);
  cVar3 = cpp_regex_traits<char>::lookup_classname<char*>
                    (&tr->super_cpp_regex_traits<char>,(char *)&local_1a,
                     (char *)((long)&local_1a + 1),false);
  this->word_ = cVar3;
  return;
}

Assistant:

assert_word_matcher(Traits const &tr)
          : word_(lookup_classname(tr, "w"))
        {
            BOOST_ASSERT(0 != this->word_);
        }